

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  TestResult *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ostream *poVar1;
  TestPartResult *pTVar2;
  int line;
  undefined8 uVar3;
  TimeInMillis ms;
  char *pcVar4;
  int iVar5;
  int i;
  undefined1 local_a8 [8];
  string message;
  undefined1 local_58 [8];
  string location;
  
  poVar1 = std::operator<<(stream,"    <testcase name=\"");
  location.field_2._8_8_ = test_info;
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_58,(test_info->name_)._M_dataplus._M_p);
  poVar1 = std::operator<<(poVar1,(char *)local_58);
  std::operator<<(poVar1,"\"");
  String::~String((String *)local_58);
  if ((*(long **)(location.field_2._8_8_ + 0x48) != (long *)0x0) &&
     (**(long **)(location.field_2._8_8_ + 0x48) != 0)) {
    poVar1 = std::operator<<(stream," value_param=\"");
    if (*(undefined8 **)(location.field_2._8_8_ + 0x48) == (undefined8 *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (char *)**(undefined8 **)(location.field_2._8_8_ + 0x48);
    }
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_58,pcVar4);
    poVar1 = internal::operator<<(poVar1,(String *)local_58);
    std::operator<<(poVar1,"\"");
    String::~String((String *)local_58);
  }
  if ((*(long **)(location.field_2._8_8_ + 0x40) != (long *)0x0) &&
     (**(long **)(location.field_2._8_8_ + 0x40) != 0)) {
    poVar1 = std::operator<<(stream," type_param=\"");
    if (*(undefined8 **)(location.field_2._8_8_ + 0x40) == (undefined8 *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (char *)**(undefined8 **)(location.field_2._8_8_ + 0x40);
    }
    EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_58,pcVar4);
    poVar1 = internal::operator<<(poVar1,(String *)local_58);
    std::operator<<(poVar1,"\"");
    String::~String((String *)local_58);
  }
  poVar1 = std::operator<<(stream," status=\"");
  uVar3 = location.field_2._8_8_;
  pcVar4 = "notrun";
  if (*(char *)(location.field_2._8_8_ + 0x58) != '\0') {
    pcVar4 = "run";
  }
  poVar1 = std::operator<<(poVar1,pcVar4);
  poVar1 = std::operator<<(poVar1,"\" time=\"");
  FormatTimeInMillisAsSeconds_abi_cxx11_((string *)local_58,*(internal **)(uVar3 + 0xd0),ms);
  poVar1 = std::operator<<(poVar1,(string *)local_58);
  poVar1 = std::operator<<(poVar1,"\" classname=\"");
  EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_a8,test_case_name);
  poVar1 = std::operator<<(poVar1,(char *)local_a8);
  poVar1 = std::operator<<(poVar1,"\"");
  result = (TestResult *)(location.field_2._8_8_ + 0x68);
  TestPropertiesAsXmlAttributes((XmlUnitTestResultPrinter *)((long)&message.field_2 + 8),result);
  std::operator<<(poVar1,(char *)message.field_2._8_8_);
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (&message.field_2._M_allocated_capacity + 1);
  String::~String((String *)__return_storage_ptr__);
  String::~String((String *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  iVar5 = 0;
  for (i = 0; i < (int)((ulong)(*(long *)(location.field_2._8_8_ + 0xa0) -
                               *(long *)(location.field_2._8_8_ + 0x98)) >> 6); i = i + 1) {
    uVar3 = location.field_2._8_8_;
    pTVar2 = TestResult::GetTestPartResult(result,i);
    line = (int)uVar3;
    if (pTVar2->type_ != kSuccess) {
      if (iVar5 == 0) {
        std::operator<<(stream,">\n");
      }
      poVar1 = std::operator<<(stream,"      <failure message=\"");
      EscapeXmlAttribute((XmlUnitTestResultPrinter *)local_58,(pTVar2->summary_).c_str_);
      poVar1 = std::operator<<(poVar1,(char *)local_58);
      std::operator<<(poVar1,"\" type=\"\">");
      String::~String((String *)local_58);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)local_58,(internal *)(pTVar2->file_name_).c_str_,
                 (char *)(ulong)(uint)pTVar2->line_number_,line);
      std::operator+(__return_storage_ptr__,(string *)local_58,"\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     __return_storage_ptr__,(pTVar2->message_).c_str_);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      RemoveInvalidXmlCharacters
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      OutputXmlCDataSection(stream,(char *)message.field_2._8_8_);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::operator<<(stream,"</failure>\n");
      iVar5 = iVar5 + 1;
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  pcVar4 = "    </testcase>\n";
  if (iVar5 == 0) {
    pcVar4 = " />\n";
  }
  std::operator<<(stream,pcVar4);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string message = location + "\n" + part.message();
      OutputXmlCDataSection(stream,
                            RemoveInvalidXmlCharacters(message).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}